

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O1

void __thiscall
OpenMD::LDForceModifier::genRandomForceAndTorque
          (LDForceModifier *this,Vector3d *force,Vector3d *torque,uint index)

{
  normal_distribution<double> *this_00;
  uint i;
  long lVar1;
  long lVar2;
  double (*__return_storage_ptr__) [6];
  double dVar3;
  Vector<double,_6U> result;
  double local_1a8;
  result_type_conflict rStack_1a0;
  result_type_conflict local_198;
  result_type_conflict rStack_190;
  result_type_conflict local_188;
  result_type_conflict rStack_180;
  double local_178 [42];
  
  this_00 = &this->forceDistribution_;
  local_188 = 0.0;
  rStack_180 = 0.0;
  local_198 = 0.0;
  rStack_190 = 0.0;
  local_1a8 = 0.0;
  rStack_1a0 = 0.0;
  local_1a8 = std::normal_distribution<double>::operator()
                        (this_00,(this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&this_00->_M_param);
  rStack_1a0 = std::normal_distribution<double>::operator()
                         (this_00,(this->randNumGen_).
                                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,&this_00->_M_param);
  local_198 = std::normal_distribution<double>::operator()
                        (this_00,(this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&this_00->_M_param);
  rStack_190 = std::normal_distribution<double>::operator()
                         (this_00,(this->randNumGen_).
                                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,&this_00->_M_param);
  local_188 = std::normal_distribution<double>::operator()
                        (this_00,(this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&this_00->_M_param);
  rStack_180 = std::normal_distribution<double>::operator()
                         (this_00,(this->randNumGen_).
                                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,&this_00->_M_param);
  __return_storage_ptr__ = (double (*) [6])(local_178 + 6);
  HydroProp::getS((Mat6x6d *)__return_storage_ptr__,
                  (this->hydroProps_).
                  super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[index]);
  local_178[4] = 0.0;
  local_178[5] = 0.0;
  local_178[2] = 0.0;
  local_178[3] = 0.0;
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  lVar1 = 0;
  do {
    dVar3 = local_178[lVar1];
    lVar2 = 0;
    do {
      dVar3 = dVar3 + ((RectMatrix<double,_6U,_6U> *)*__return_storage_ptr__)->data_[0][lVar2] *
                      (&local_1a8)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 6);
    local_178[lVar1] = dVar3;
    lVar1 = lVar1 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar1 != 6);
  (force->super_Vector<double,_3U>).data_[0] = local_178[0];
  (force->super_Vector<double,_3U>).data_[1] = local_178[1];
  (force->super_Vector<double,_3U>).data_[2] = local_178[2];
  (torque->super_Vector<double,_3U>).data_[0] = local_178[3];
  (torque->super_Vector<double,_3U>).data_[1] = local_178[4];
  (torque->super_Vector<double,_3U>).data_[2] = local_178[5];
  return;
}

Assistant:

void LDForceModifier::genRandomForceAndTorque(Vector3d& force,
                                                Vector3d& torque,
                                                unsigned int index) {
    Vector<RealType, 6> Z;
    Vector<RealType, 6> generalForce;

    Z[0] = forceDistribution_(*randNumGen_);
    Z[1] = forceDistribution_(*randNumGen_);
    Z[2] = forceDistribution_(*randNumGen_);
    Z[3] = forceDistribution_(*randNumGen_);
    Z[4] = forceDistribution_(*randNumGen_);
    Z[5] = forceDistribution_(*randNumGen_);

    generalForce = hydroProps_[index]->getS() * Z;

    force[0]  = generalForce[0];
    force[1]  = generalForce[1];
    force[2]  = generalForce[2];
    torque[0] = generalForce[3];
    torque[1] = generalForce[4];
    torque[2] = generalForce[5];
  }